

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_point_read_binary
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *pt,uchar *buf,size_t ilen)

{
  int iVar1;
  size_t buflen;
  
  iVar1 = -0x4f80;
  if (ilen != 0) {
    if (*buf == '\0') {
      if (ilen == 1) {
        iVar1 = mbedtls_ecp_set_zero(pt);
        return iVar1;
      }
    }
    else {
      buflen = mbedtls_mpi_size(&grp->P);
      iVar1 = -0x4e80;
      if ((*buf == '\x04') && (iVar1 = -0x4f80, buflen * 2 + 1 == ilen)) {
        iVar1 = mbedtls_mpi_read_binary(&pt->X,buf + 1,buflen);
        if (iVar1 == 0) {
          iVar1 = mbedtls_mpi_read_binary(&pt->Y,buf + 1 + buflen,buflen);
          if (iVar1 == 0) {
            iVar1 = mbedtls_mpi_lset(&pt->Z,1);
            return iVar1;
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecp_point_read_binary( const mbedtls_ecp_group *grp, mbedtls_ecp_point *pt,
                           const unsigned char *buf, size_t ilen )
{
    int ret;
    size_t plen;

    if( ilen < 1 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( buf[0] == 0x00 )
    {
        if( ilen == 1 )
            return( mbedtls_ecp_set_zero( pt ) );
        else
            return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
    }

    plen = mbedtls_mpi_size( &grp->P );

    if( buf[0] != 0x04 )
        return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );

    if( ilen != 2 * plen + 1 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &pt->X, buf + 1, plen ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &pt->Y, buf + 1 + plen, plen ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->Z, 1 ) );

cleanup:
    return( ret );
}